

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

RegSlot __thiscall Js::FunctionBody::GetFirstTmpReg(FunctionBody *this)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  undefined4 *puVar4;
  
  if ((this->field_0x17d & 1) != 0) {
    uVar3 = GetCountField(this,FirstTmpRegister);
    if (uVar3 != 0xffffffff) goto LAB_00768108;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar4 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                              ,0x4ab,"(GetFirstTmpRegister() != Constants::NoRegister)",
                              "First temp hasn\'t been set yet");
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  *puVar4 = 0;
LAB_00768108:
  if ((this->field_0x17d & 1) == 0) {
    return 0xffffffff;
  }
  uVar3 = GetCountField(this,FirstTmpRegister);
  return uVar3;
}

Assistant:

RegSlot
    FunctionBody::GetFirstTmpReg()
    {
        AssertMsg(GetFirstTmpRegister() != Constants::NoRegister, "First temp hasn't been set yet");
        return GetFirstTmpRegister();
    }